

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic_logger.cpp
# Opt level: O0

void __thiscall
BasicLoggerTimeFixture_ArbitraryPointInTime_Test::TestBody
          (BasicLoggerTimeFixture_ArbitraryPointInTime_Test *this)

{
  bool bVar1;
  char *pcVar2;
  pointer rhs;
  AssertHelper local_a8;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80;
  unsigned_long local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  storage_type<pstore::gsl::details::extent_type<25L>_> local_50;
  size_t local_48;
  size_t r;
  time_t time;
  time_zone_setter tzs;
  BasicLoggerTimeFixture_ArbitraryPointInTime_Test *this_local;
  
  tzs.old_.storage_._24_8_ = this;
  anon_unknown.dwarf_1e550::time_zone_setter::time_zone_setter((time_zone_setter *)&time,"UTC0");
  r = 0x5641868c;
  local_50.data_ =
       (pointer)pstore::gsl::make_span<char,25ul>(&(this->super_BasicLoggerTimeFixture).buffer_);
  local_48 = pstore::basic_logger::time_string(0x5641868c,(span<char,_25L> *)&local_50);
  local_78 = 0x18;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_70,"std::size_t{24}","r",&local_78,&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_basic_logger.cpp"
               ,0xb7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  anon_unknown.dwarf_1e550::BasicLoggerTimeFixture::canonicalize_sign
            (&this->super_BasicLoggerTimeFixture);
  rhs = std::array<char,_25UL>::data(&(this->super_BasicLoggerTimeFixture).buffer_);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_98,"\"2015-11-10T05:54:20-0000\"","buffer_.data ()",
             "2015-11-10T05:54:20-0000",rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_basic_logger.cpp"
               ,0xb9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  anon_unknown.dwarf_1e550::time_zone_setter::~time_zone_setter((time_zone_setter *)&time);
  return;
}

Assistant:

TEST_F (BasicLoggerTimeFixture, ArbitraryPointInTime) {
    time_zone_setter tzs ("UTC0");
    std::time_t const time{1447134860};
    std::size_t const r =
        pstore::basic_logger::time_string (time, pstore::gsl::make_span (buffer_));
    EXPECT_EQ (std::size_t{24}, r);
    this->canonicalize_sign ();
    EXPECT_STREQ ("2015-11-10T05:54:20-0000", buffer_.data ());
}